

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::InputFile::setFrameBuffer(InputFile *this,FrameBuffer *frameBuffer)

{
  ulong uVar1;
  _Base_ptr fv;
  _Rb_tree_color _Var2;
  pthread_mutex_t *__mutex;
  Data *pDVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  ConstIterator CVar9;
  Box2i *pBVar10;
  FrameBuffer *pFVar11;
  void *pvVar12;
  ArgExc *this_00;
  _Rb_tree_header *p_Var13;
  undefined1 in_R10B;
  Slice local_68;
  
  __mutex = (pthread_mutex_t *)this->_data;
  if (*(char *)((long)__mutex + 100) != '\x01') {
    if ((CompositeDeepScanLine *)__mutex[5].__align != (CompositeDeepScanLine *)0x0) {
      CompositeDeepScanLine::setFrameBuffer((CompositeDeepScanLine *)__mutex[5].__align,frameBuffer)
      ;
      return;
    }
    ScanLineInputFile::setFrameBuffer(*(ScanLineInputFile **)((long)__mutex + 0x70),frameBuffer);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&this->_data->tFileBuffer,
                (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)frameBuffer);
    return;
  }
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  pFVar11 = &this->_data->tFileBuffer;
  cVar7._M_node = (_Base_ptr)FrameBuffer::begin(pFVar11);
  cVar8._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  while( true ) {
    CVar9 = FrameBuffer::end(pFVar11);
    if ((const_iterator)cVar7._M_node == CVar9._i._M_node) break;
    CVar9 = FrameBuffer::end(frameBuffer);
    if ((const_iterator)cVar8._M_node == CVar9._i._M_node) break;
    iVar4 = strcmp((char *)(cVar7._M_node + 1),(char *)(cVar8._M_node + 1));
    if ((iVar4 != 0) || (cVar7._M_node[9]._M_color != cVar8._M_node[9]._M_color)) break;
    cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
    cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
  }
  CVar9 = FrameBuffer::end(pFVar11);
  if ((const_iterator)cVar7._M_node == CVar9._i._M_node) {
    CVar9 = FrameBuffer::end(frameBuffer);
    if ((const_iterator)cVar8._M_node == CVar9._i._M_node) goto LAB_0056ed88;
  }
  Data::deleteCachedBuffer(this->_data);
  pDVar3 = this->_data;
  pDVar3->cachedTileY = -1;
  pBVar10 = Header::dataWindow(&pDVar3->header);
  pFVar11 = (FrameBuffer *)operator_new(0x30);
  p_Var13 = &(pFVar11->_map)._M_t._M_impl.super__Rb_tree_header;
  (pFVar11->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pFVar11->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pFVar11->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (pFVar11->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pFVar11->_map)._M_t._M_impl = 0;
  *(undefined8 *)&(pFVar11->_map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pFVar11->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
  (pFVar11->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
  (pFVar11->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pDVar3 = this->_data;
  pDVar3->cachedBuffer = pFVar11;
  iVar4 = (pBVar10->min).x;
  pDVar3->offset = iVar4;
  iVar6 = (pBVar10->max).x;
  uVar5 = TiledInputFile::tileYSize(pDVar3->tFile);
  uVar5 = uiMult<unsigned_int>((iVar6 - iVar4) + 1,uVar5);
  cVar7._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  uVar1 = (ulong)uVar5 * 4;
  while( true ) {
    CVar9 = FrameBuffer::end(frameBuffer);
    if ((const_iterator)cVar7._M_node == CVar9._i._M_node) break;
    _Var2 = cVar7._M_node[9]._M_color;
    fv = cVar7._M_node[10]._M_parent;
    if (_Var2 == _S_red) {
      pDVar3 = this->_data;
      pFVar11 = pDVar3->cachedBuffer;
      pvVar12 = operator_new__(uVar1);
      iVar4 = pDVar3->offset;
      iVar6 = TiledInputFile::levelWidth(pDVar3->tFile,0);
      Slice::Slice(&local_68,UINT,(char *)((long)pvVar12 + (long)iVar4 * -4),4,(long)iVar6 << 2,1,1,
                   (double)fv,(bool)in_R10B,true);
      FrameBuffer::insert(pFVar11,(char *)(cVar7._M_node + 1),&local_68);
    }
    else if (_Var2 == _S_black) {
      pDVar3 = this->_data;
      pFVar11 = pDVar3->cachedBuffer;
      pvVar12 = operator_new__((ulong)uVar5 * 2);
      iVar4 = pDVar3->offset;
      iVar6 = TiledInputFile::levelWidth(pDVar3->tFile,0);
      Slice::Slice(&local_68,HALF,(char *)((long)pvVar12 + (long)iVar4 * -2),2,(long)iVar6 * 2,1,1,
                   (double)fv,(bool)in_R10B,true);
      FrameBuffer::insert(pFVar11,(char *)(cVar7._M_node + 1),&local_68);
    }
    else {
      if (_Var2 != 2) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
        __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pDVar3 = this->_data;
      pFVar11 = pDVar3->cachedBuffer;
      pvVar12 = operator_new__(uVar1);
      iVar4 = pDVar3->offset;
      iVar6 = TiledInputFile::levelWidth(pDVar3->tFile,0);
      Slice::Slice(&local_68,FLOAT,(char *)((long)pvVar12 + (long)iVar4 * -4),4,(long)iVar6 << 2,1,1
                   ,(double)fv,(bool)in_R10B,true);
      FrameBuffer::insert(pFVar11,(char *)(cVar7._M_node + 1),&local_68);
    }
    cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
  }
  TiledInputFile::setFrameBuffer(this->_data->tFile,this->_data->cachedBuffer);
LAB_0056ed88:
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&this->_data->tFileBuffer,
              (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)frameBuffer);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
InputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    if (_data->isTiled)
    {
	Lock lock (*_data);

	//
        // We must invalidate the cached buffer if the new frame
	// buffer has a different set of channels than the old
	// frame buffer, or if the type of a channel has changed.
	//

	const FrameBuffer &oldFrameBuffer = _data->tFileBuffer;

	FrameBuffer::ConstIterator i = oldFrameBuffer.begin();
	FrameBuffer::ConstIterator j = frameBuffer.begin();

	while (i != oldFrameBuffer.end() && j != frameBuffer.end())
	{
	    if (strcmp (i.name(), j.name()) || i.slice().type != j.slice().type)
		break;

	    ++i;
	    ++j;
	}

	if (i != oldFrameBuffer.end() || j != frameBuffer.end())
        {
	    //
	    // Invalidate the cached buffer.
	    //

            _data->deleteCachedBuffer ();
	    _data->cachedTileY = -1;

	    //
	    // Create new a cached frame buffer.  It can hold a single
	    // row of tiles.  The cached buffer can be reused for each
	    // row of tiles because we set the yTileCoords parameter of
	    // each Slice to true.
	    //

	    const Box2i &dataWindow = _data->header.dataWindow();
	    _data->cachedBuffer = new FrameBuffer();
	    _data->offset = dataWindow.min.x;
	    
	    unsigned int tileRowSize =
                uiMult(dataWindow.max.x - dataWindow.min.x + 1U,
                       _data->tFile->tileYSize());

	    for (FrameBuffer::ConstIterator k = frameBuffer.begin();
		 k != frameBuffer.end();
		 ++k)
	    {
		Slice s = k.slice();

		switch (s.type)
		{
		  case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		    _data->cachedBuffer->insert
			(k.name(),
			 Slice (UINT,
				(char *)(new unsigned int[tileRowSize] - 
					_data->offset),
				sizeof (unsigned int),
				sizeof (unsigned int) *
				    _data->tFile->levelWidth(0),
				1, 1,
				s.fillValue,
				false, true));
		    break;

		  case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		    _data->cachedBuffer->insert
			(k.name(),
			 Slice (HALF,
				(char *)(new half[tileRowSize] - 
					_data->offset),
				sizeof (half),
				sizeof (half) *
				    _data->tFile->levelWidth(0),
				1, 1,
				s.fillValue,
				false, true));
		    break;

		  case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		    _data->cachedBuffer->insert
			(k.name(),
			 Slice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
				(char *)(new float[tileRowSize] - 
					_data->offset),
				sizeof(float),
				sizeof(float) *
				    _data->tFile->levelWidth(0),
				1, 1,
				s.fillValue,
				false, true));
		    break;

		  default:

		    throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
		}
	    }

	    _data->tFile->setFrameBuffer (*_data->cachedBuffer);
        }

	_data->tFileBuffer = frameBuffer;
    }
    else if(_data->compositor)
    {
        _data->compositor->setFrameBuffer(frameBuffer);
    }else {
        _data->sFile->setFrameBuffer(frameBuffer);
        _data->tFileBuffer = frameBuffer;
    }
}